

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

string * __thiscall
util::format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,char *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,char (*args_1) [2]
          )

{
  size_type *psVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  ulong uVar3;
  undefined8 uVar4;
  allocator<char> local_a9;
  string local_a8;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  args_00 = args;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,(char *)this,&local_a9);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_48,local_40 + (long)local_48);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,*(long *)arg,*(long *)(arg + 8) + *(long *)arg);
  format<std::__cxx11::string,char_const(&)[2]>
            (&local_a8,(util *)local_68,args,(char (*) [2])args_00);
  uVar3 = 0xf;
  if (local_88 != local_78) {
    uVar3 = local_78[0];
  }
  if (uVar3 < local_a8._M_string_length + local_80) {
    uVar4 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar4 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_80 <= (ulong)uVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
      goto LAB_0016a792;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
LAB_0016a792:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}